

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

bool ImGui::TableSetColumnIndex(int column_n)

{
  ImGuiTable *table;
  bool bVar1;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    bVar1 = false;
  }
  else {
    if (table->CurrentColumn != column_n) {
      if (table->CurrentColumn != -1) {
        TableEndCell(table);
      }
      TableBeginCell(table,column_n);
    }
    bVar1 = (table->RequestOutputMaskByIndex >> ((ulong)(uint)column_n & 0x3f) & 1) != 0;
  }
  return bVar1;
}

Assistant:

bool ImGui::TableSetColumnIndex(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;

    if (table->CurrentColumn != column_n)
    {
        if (table->CurrentColumn != -1)
            TableEndCell(table);
        IM_ASSERT(column_n >= 0 && table->ColumnsCount);
        TableBeginCell(table, column_n);
    }

    // Return whether the column is visible. User may choose to skip submitting items based on this return value,
    // however they shouldn't skip submitting for columns that may have the tallest contribution to row height.
    return (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)) != 0;
}